

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCaseInfo *testInfo)

{
  string *__lhs;
  set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
  *this_00;
  bool bVar1;
  ostream *poVar2;
  iterator iVar3;
  string local_280;
  TestCaseInfo local_260;
  ostringstream oss;
  
  __lhs = &testInfo->m_name;
  bVar1 = std::operator==(__lhs,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,(string *)__lhs);
    poVar2 = std::operator<<(poVar2,"unnamed/");
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    TestCaseInfo::TestCaseInfo(&local_260,testInfo,&local_280);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_260);
    TestCaseInfo::~TestCaseInfo(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  else {
    this_00 = &this->m_functions;
    iVar3 = std::
            _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
            ::find(&this_00->_M_t,testInfo);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_functions)._M_t._M_impl.super__Rb_tree_header)
    {
      iVar3 = std::
              _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
              ::find(&this_00->_M_t,testInfo);
      poVar2 = std::operator<<((ostream *)&std::cerr,"error: TEST_CASE( \"");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2,"\" ) already defined.\n");
      poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
      SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)&oss,(SourceLineInfo *)&iVar3._M_node[5]._M_right);
      poVar2 = operator<<(poVar2,(SourceLineInfo *)&oss);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"\tRedefined at ");
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)&local_260,&testInfo->m_lineInfo);
      poVar2 = operator<<(poVar2,(SourceLineInfo *)&local_260);
      std::endl<char,std::char_traits<char>>(poVar2);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&local_260);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&oss);
      exit(1);
    }
    std::
    _Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
    ::_M_insert_unique<Catch::TestCaseInfo_const&>
              ((_Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
                *)this_00,testInfo);
    std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
              (&this->m_functionsInOrder,testInfo);
    if (testInfo->m_isHidden == false) {
      std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
                (&this->m_nonHiddenFunctions,testInfo);
      return;
    }
  }
  return;
}

Assistant:

virtual void registerTest( const TestCaseInfo& testInfo ) {
            if( testInfo.getName() == "" ) {
                std::ostringstream oss;
                oss << testInfo.getName() << "unnamed/" << ++m_unnamedCount;
                return registerTest( TestCaseInfo( testInfo, oss.str() ) );
            }

            if( m_functions.find( testInfo ) == m_functions.end() ) {
                m_functions.insert( testInfo );
                m_functionsInOrder.push_back( testInfo );
                if( !testInfo.isHidden() )
                    m_nonHiddenFunctions.push_back( testInfo );
            }
            else {
                const TestCaseInfo& prev = *m_functions.find( testInfo );
                std::cerr   << "error: TEST_CASE( \"" << testInfo.getName() << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getLineInfo() ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testInfo.getLineInfo() ) << std::endl;
                exit(1);
            }
        }